

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O0

void __thiscall
pzgeom::TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
          (TPZNodeRep<3,_pztopology::TPZLine> *this,void **vtt,TPZVec<long> *nodeindexes)

{
  int64_t iVar1;
  long *__src;
  TPZVec<long> *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int i;
  int nn;
  void **in_stack_ffffffffffffffa8;
  TPZLine *in_stack_ffffffffffffffb0;
  int local_30;
  
  pztopology::TPZLine::TPZLine(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = *in_RSI;
  iVar1 = TPZVec<long>::NElements(in_RDX);
  if (iVar1 < 3) {
    iVar1 = TPZVec<long>::NElements(in_RDX);
    local_30 = (int)iVar1;
  }
  else {
    local_30 = 3;
  }
  __src = TPZVec<long>::operator[](in_RDX,0);
  memcpy(in_RDI + 1,__src,(long)local_30 << 3);
  for (; local_30 < 3; local_30 = local_30 + 1) {
    in_RDI[(long)local_30 + 1] = 0xffffffffffffffff;
  }
  return;
}

Assistant:

TPZNodeRep(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZNodeRep::ClassId)
        {
            int nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifdef PZDEBUG
            if(nn<N)
            {
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
        }